

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_status.cpp
# Opt level: O1

void __thiscall libtorrent::torrent_status::~torrent_status(torrent_status *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Head_base<0UL,_unsigned_int_*,_false> _Var3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  
  _Var3._M_head_impl =
       *(uint **)&(this->verified_pieces).super_bitfield.m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var3._M_head_impl !=
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    operator_delete__(_Var3._M_head_impl);
  }
  (this->verified_pieces).super_bitfield.m_buf.
  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> =
       (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0;
  _Var3._M_head_impl =
       *(uint **)&(this->pieces).super_bitfield.m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var3._M_head_impl !=
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    operator_delete__(_Var3._M_head_impl);
  }
  (this->pieces).super_bitfield.m_buf.
  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> =
       (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0;
  pcVar4 = (this->current_tracker)._M_dataplus._M_p;
  paVar2 = &(this->current_tracker).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  p_Var5 = (this->torrent_file).
           super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar6 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
    }
  }
  pcVar4 = (this->name)._M_dataplus._M_p;
  paVar2 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->save_path)._M_dataplus._M_p;
  paVar2 = &(this->save_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  p_Var5 = (this->handle).m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar6 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

torrent_status::~torrent_status() = default;